

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O1

void __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::remove<Inferences::ALASCA::FourierMotzkinConf::Lhs>
          (SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
           *this,Lhs *key)

{
  Node *ld2;
  Comparison CVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  Node *pNVar6;
  Node *pNVar7;
  uint uVar8;
  uint uVar9;
  void **head;
  Node *pNVar10;
  
  uVar8 = this->_top - 1;
  pNVar6 = this->_left;
  do {
    pNVar7 = pNVar6->nodes[uVar8];
    if (pNVar7 == (Node *)0x0) {
      uVar8 = uVar8 - 1;
      pNVar7 = pNVar6;
      iVar5 = 3;
    }
    else {
      CVar1 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator
              ::compare<Inferences::ALASCA::FourierMotzkinConf::Lhs>(key,&pNVar7->value);
      iVar5 = 0;
      if (CVar1 != GREATER) {
        if (CVar1 == EQUAL) {
          pNVar10 = pNVar7;
          if (uVar8 == 0) {
            uVar8 = 0;
          }
          else {
            ld2 = pNVar7->nodes[0];
            if (((ld2 != (Node *)0x0) && (pNVar7->nodes[uVar8] != ld2)) &&
               (CVar1 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
                        LDComparator::compare<Inferences::ALASCA::FourierMotzkinConf::Lhs>
                                  (key,&ld2->value), CVar1 == EQUAL)) {
              pNVar10 = pNVar7->nodes[0];
              uVar8 = 0xffffffff;
              do {
                uVar9 = uVar8 + 2;
                uVar8 = uVar8 + 1;
                pNVar6 = pNVar7;
              } while (pNVar10 == pNVar7->nodes[uVar9]);
            }
          }
          uVar2 = (ulong)uVar8;
          pNVar6->nodes[uVar2] = pNVar10->nodes[uVar2];
          uVar3 = uVar2;
          if (uVar8 != 0) {
            do {
              uVar4 = uVar3 - 1;
              pNVar7 = pNVar6;
              do {
                pNVar6 = pNVar7;
                pNVar7 = *(Node **)((long)&(pNVar6->value).super_SelectedSummand.
                                           super_SelectedLiteral.interpreted.
                                           super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                           ._elem._elem + uVar3 * 8 + 0x18);
              } while (pNVar7 != pNVar10);
              *(undefined8 *)
               ((long)&(pNVar6->value).super_SelectedSummand.super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + uVar3 * 8 + 0x18) =
                   *(undefined8 *)
                    ((long)&(pNVar10->value).super_SelectedSummand.super_SelectedLiteral.interpreted
                            .
                            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                            ._elem._elem + uVar3 * 8 + 0x18);
              uVar3 = uVar4;
            } while (uVar4 != 0);
          }
          iVar5 = 1;
          uVar9 = 0;
          pNVar7 = pNVar6;
          uVar8 = 0;
          if (pNVar10 != (Node *)0x0) {
            uVar3 = uVar2 * 8 + 0x47 & 0xfffffffffffffff0;
            uVar8 = uVar9;
            if (uVar3 == 0) {
              (pNVar10->value).super_SelectedSummand.super_SelectedLiteral.cl =
                   (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pNVar10;
            }
            else if (uVar3 < 0x11) {
              (pNVar10->value).super_SelectedSummand.super_SelectedLiteral.cl =
                   (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pNVar10;
            }
            else if (uVar3 < 0x19) {
              (pNVar10->value).super_SelectedSummand.super_SelectedLiteral.cl =
                   (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pNVar10;
            }
            else if (uVar3 < 0x21) {
              (pNVar10->value).super_SelectedSummand.super_SelectedLiteral.cl =
                   (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pNVar10;
            }
            else if (uVar3 < 0x31) {
              (pNVar10->value).super_SelectedSummand.super_SelectedLiteral.cl =
                   (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pNVar10;
            }
            else if (uVar3 < 0x41) {
              (pNVar10->value).super_SelectedSummand.super_SelectedLiteral.cl =
                   (Clause *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
              GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pNVar10;
            }
            else {
              operator_delete(pNVar10,0x10);
            }
          }
        }
        else {
          pNVar7 = pNVar6;
          iVar5 = 0;
          if (CVar1 == LESS) {
            uVar8 = uVar8 - 1;
            iVar5 = 0;
          }
        }
      }
    }
    pNVar6 = pNVar7;
  } while ((iVar5 == 0) || (iVar5 == 3));
  return;
}

Assistant:

void remove(Key key)
  {
    ASS(_top > 0);

    Node* found = 0; // found node
#if VDEBUG
    unsigned foundHeight = 0; // its height
#else
    unsigned foundHeight; // its height
#endif

    Node* left = _left;
    unsigned h = _top-1;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	ASS(h != 0); //this would mean that the value is not present in the list
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  ASS(h != 0);
	  h--;
	  break;

	case GREATER:
	  left = next;
	  break;

	case EQUAL:
	  found = next;
	  foundHeight = h;
	  if(h>0 && found->nodes[0] && found->nodes[h]!=found->nodes[0] &&
		  ValueComparator::compare(key,found->nodes[0]->value)==EQUAL) {
	    //The next element exists, contains the same value,
	    //and its height is lower that the height of this one.
	    //We'll rather delete that one, than the one we've found,
	    //because otherwise there'd be only low elements after a few
	    //deletions, which would degrade the skip list to linked list.
	    h=0;
	    while(found->nodes[0]==found->nodes[h+1]) {
	      h++;
	    }
	    left = found;
	    found = found->nodes[0];
	    foundHeight = h;
	  }
	  for(;;) {
	    left->nodes[h] = found->nodes[h];
	    if(h==0) {
	      break;
	    }
	    h--;
	    while(left->nodes[h]!=found) {
	      left=left->nodes[h];
	      ASS(ValueComparator::compare(key,left->value)!=LESS);
	    }
	  }

	  deallocate(found,foundHeight);
	  return;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }